

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ExprList_item *pEVar5;
  Walker WStack_58;
  
  if (pExpr != (Expr *)0x0) {
    do {
      if ((pExpr->flags & 0x82000) == 0) {
        if ((pParse->okConstFactor != '\0') && (pExpr->op != 0xb0)) {
          WStack_58.eCode = 2;
          WStack_58.xExprCallback = exprNodeIsConstant;
          WStack_58.xSelectCallback = sqlite3SelectWalkFail;
          WStack_58.u.n = 0;
          walkExpr(&WStack_58,pExpr);
          if (WStack_58.eCode != 0) {
            *pReg = 0;
            iVar4 = sqlite3ExprCodeRunJustOnce(pParse,pExpr,-1);
            return iVar4;
          }
        }
        goto LAB_00187353;
      }
      if ((pExpr->flags >> 0x13 & 1) == 0) {
        pEVar5 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar5 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar5->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
  pExpr = (Expr *)0x0;
LAB_00187353:
  if (pParse->nTempReg == '\0') {
    iVar4 = pParse->nMem + 1;
    pParse->nMem = iVar4;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    iVar4 = pParse->aTempReg[bVar1];
  }
  iVar2 = sqlite3ExprCodeTarget(pParse,pExpr,iVar4);
  iVar3 = iVar4;
  if ((iVar2 != iVar4) && (iVar3 = 0, iVar4 != 0)) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = iVar4;
    }
  }
  *pReg = iVar3;
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( ConstFactorOk(pParse)
   && ALWAYS(pExpr!=0)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeRunJustOnce(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}